

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::setupCutoffs(ForceManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CutoffMethod CVar2;
  Globals *pGVar3;
  pointer pcVar4;
  int iVar5;
  SwitchingFunctionType SVar6;
  undefined8 in_RAX;
  mapped_type *pmVar7;
  iterator iVar8;
  SwitchingFunction *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  size_t __n;
  char *__src;
  double dVar10;
  RealType RVar11;
  string myMethod;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  stringToCutoffMethod;
  key_type local_e0;
  undefined4 local_bc;
  long *local_b8 [2];
  long local_a8 [2];
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_70;
  size_t local_68;
  undefined1 local_60 [16];
  _Base_ptr local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_40;
  size_t local_38;
  
  pGVar3 = this->info_->simParams_;
  this->rCut_ = 0.0;
  if ((pGVar3->MDfileVersion).super_ParameterBase.empty_ == false) {
    local_bc = (undefined4)
               CONCAT71((int7)((ulong)in_RAX >> 8),
                        1 < *(int *)&(pGVar3->MDfileVersion).super_ParameterBase.field_0x2c);
  }
  else {
    local_bc = 0;
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_60 + 8);
  local_60._8_4_ = _S_red;
  local_50 = (_Base_ptr)0x0;
  local_38 = 0;
  local_48 = paVar1;
  paStack_40 = paVar1;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)(local_98 + 8),this->info_);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::clear((_Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
           *)local_60);
  if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
    in_RCX = &local_88;
    local_60._8_4_ = local_88._M_allocated_capacity._0_4_;
    local_50 = (_Base_ptr)local_88._8_8_;
    local_48 = local_78;
    paStack_40 = paStack_70;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)(local_88._8_8_ + 8) = paVar1;
    local_38 = local_68;
    local_88._8_8_ = (_Base_ptr)0x0;
    local_68 = 0;
    local_78 = in_RCX;
    paStack_70 = in_RCX;
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree((_Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
               *)(local_98 + 8));
  if ((pGVar3->CutoffRadius).super_ParameterBase.empty_ == false) {
    dVar10 = (pGVar3->CutoffRadius).data_;
LAB_002178cc:
    this->rCut_ = dVar10;
  }
  else {
    paVar9 = local_48;
    if (this->info_->usesElectrostaticAtoms_ == true) {
      memcpy(&painCave,
             "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use a default value of 12.0 angstroms for the cutoffRadius.\n"
             ,0x8d);
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      dVar10 = 12.0;
      goto LAB_002178cc;
    }
    for (; paVar9 != paVar1;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar9)) {
      RVar11 = InteractionManager::getSuggestedCutoffRadius
                         (this->interactionMan_,(AtomType *)paVar9[2]._M_allocated_capacity);
      dVar10 = this->rCut_;
      if (this->rCut_ <= RVar11) {
        dVar10 = RVar11;
      }
      this->rCut_ = dVar10;
    }
    snprintf(painCave.errMsg,2000,
             "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use %lf angstroms.\n"
             ,this->rCut_);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  ForceDecomposition::setCutoffRadius(this->fDecomp_,this->rCut_);
  InteractionManager::setCutoffRadius(this->interactionMan_,this->rCut_);
  this->rCutSq_ = this->rCut_ * this->rCut_;
  local_88._M_allocated_capacity._0_4_ = 0;
  local_88._8_8_ = 0;
  local_68 = 0;
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  local_78 = &local_88;
  paStack_70 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"HARD","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = HARD;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SWITCHED","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = SWITCHED;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SHIFTED_POTENTIAL","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = SHIFTED_POTENTIAL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"SHIFTED_FORCE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = SHIFTED_FORCE;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"TAYLOR_SHIFTED","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = TAYLOR_SHIFTED;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"EWALD_FULL","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)(local_98 + 8),&local_e0);
  *pmVar7 = EWALD_FULL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if ((pGVar3->CutoffMethod).super_ParameterBase.empty_ == false) {
    pcVar4 = (pGVar3->CutoffMethod).data_._M_dataplus._M_p;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar4,pcVar4 + (pGVar3->CutoffMethod).data_._M_string_length);
    std::locale::locale((locale *)local_98);
    toUpperCopy<std::__cxx11::string>
              (&local_e0,(OpenMD *)local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               (locale *)in_RCX->_M_local_buf);
    std::locale::~locale((locale *)local_98);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                    *)(local_98 + 8),&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iVar8._M_node == &local_88) {
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: Could not find chosen cutoffMethod %s\n\tShould be one of: HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n\tSHIFTED_FORCE, or EWALD_FULL\n"
               ,local_e0._M_dataplus._M_p);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      this->cutoffMethod_ = iVar8._M_node[2]._M_color;
    }
LAB_00217e77:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  else if ((char)local_bc == '\0') {
    memcpy(&painCave,
           "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n\tOpenMD found a file which does not set a cutoffMethod.\n\tOpenMD will attempt to deduce a cutoffMethod using the\n\tbehavior of the older (version 1) code.  To remove this\n\twarning, add an explicit cutoffMethod and change the top\n\tof the file so that it begins with <OpenMD version=2>\n"
           ,0x150);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    if ((pGVar3->ElectrostaticSummationMethod).super_ParameterBase.empty_ == false) {
      pcVar4 = (pGVar3->ElectrostaticSummationMethod).data_._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar4,
                 pcVar4 + (pGVar3->ElectrostaticSummationMethod).data_._M_string_length);
      std::locale::locale((locale *)local_b8);
      toUpper<std::__cxx11::string>(&local_e0,(locale *)local_b8);
      std::locale::~locale((locale *)local_b8);
      iVar5 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar5 == 0) {
        this->cutoffMethod_ = SHIFTED_POTENTIAL;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar5 == 0) {
          this->cutoffMethod_ = SHIFTED_FORCE;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar5 == 0) {
            this->cutoffMethod_ = TAYLOR_SHIFTED;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_e0);
            if (iVar5 == 0) {
              this->cutoffMethod_ = EWALD_FULL;
              this->useSurfaceTerm_ = true;
            }
          }
        }
      }
      if ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false) {
        this->rSwitch_ = (pGVar3->SwitchingRadius).data_;
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_e0);
      if (((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_e0), iVar5 == 0))
           || (iVar5 = std::__cxx11::string::compare((char *)&local_e0), iVar5 == 0)) ||
          (iVar5 = std::__cxx11::string::compare((char *)&local_e0), iVar5 == 0)) &&
         ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false)) {
        snprintf(painCave.errMsg,2000,
                 "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n\tA value was set for the switchingRadius\n\teven though the electrostaticSummationMethod was\n\tset to %s\n"
                 ,local_e0._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 2;
        simError();
      }
      if (ABS(this->rCut_ - this->rSwitch_) < 0.0001) {
        if (this->cutoffMethod_ == SHIFTED_FORCE) {
          __src = 
          "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted force\n\tpotentials instead of switching functions.\n"
          ;
          __n = 0xbb;
        }
        else {
          this->cutoffMethod_ = SHIFTED_POTENTIAL;
          __src = 
          "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted potentials\n\tinstead of switching functions.\n"
          ;
          __n = 0xb5;
        }
        memcpy(&painCave,__src,__n);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
      }
      goto LAB_00217e77;
    }
  }
  else {
    memcpy(&painCave,
           "ForceManager::setupCutoffs: No value was set for the cutoffMethod.\n\tOpenMD will use SHIFTED_FORCE.\n"
           ,100);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    this->cutoffMethod_ = SHIFTED_FORCE;
  }
  this_00 = (SwitchingFunction *)operator_new(0x40);
  SwitchingFunction::SwitchingFunction(this_00);
  this->switcher_ = this_00;
  CVar2 = this->cutoffMethod_;
  if (CVar2 == SWITCHED) {
    if ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false) {
      dVar10 = (pGVar3->SwitchingRadius).data_;
      this->rSwitch_ = dVar10;
      if (dVar10 <= this->rCut_) goto LAB_00218000;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: switchingRadius (%f) is larger than the cutoffRadius(%f)\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
    }
    else {
      this->rSwitch_ = this->rCut_ * 0.85;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the switchingRadius.\n\tOpenMD will use a default value of 85 percent of the cutoffRadius.\n\tswitchingRadius = %f. for this simulation\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 2;
    }
    simError();
  }
  else {
    if (((char)local_bc != '\0') && ((pGVar3->SwitchingRadius).super_ParameterBase.empty_ == false))
    {
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      for (paVar9 = local_78; paVar9 != &local_88;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar9)) {
        if (*(CutoffMethod *)(paVar9 + 4) == CVar2) {
          std::__cxx11::string::_M_assign((string *)&local_e0);
          break;
        }
      }
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: the cutoffMethod (%s)\n\tis not set to SWITCHED, so switchingRadius value\n\twill be ignored for this simulation\n"
               ,local_e0._M_dataplus._M_p);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
    }
    this->rSwitch_ = this->rCut_;
  }
LAB_00218000:
  this->sft_ = cubic;
  if ((pGVar3->SwitchingFunctionType).super_ParameterBase.empty_ != false) goto LAB_002180e1;
  pcVar4 = (pGVar3->SwitchingFunctionType).data_._M_dataplus._M_p;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar4,
             pcVar4 + (pGVar3->SwitchingFunctionType).data_._M_string_length);
  std::locale::locale((locale *)local_b8);
  toUpper<std::__cxx11::string>(&local_e0,(locale *)local_b8);
  std::locale::~locale((locale *)local_b8);
  iVar5 = std::__cxx11::string::compare((char *)&local_e0);
  if (iVar5 == 0) {
    SVar6 = cubic;
LAB_002180c7:
    this->sft_ = SVar6;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_e0);
    if (iVar5 == 0) {
      SVar6 = fifth_order_poly;
      goto LAB_002180c7;
    }
    snprintf(painCave.errMsg,2000,
             "ForceManager::setupSwitching : Unknown switchingFunctionType. (Input file specified %s .)\n\tswitchingFunctionType must be one of: \"cubic\" or \"fifth_order_polynomial\"."
             ,local_e0._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
LAB_002180e1:
  SwitchingFunction::setSwitchType(this->switcher_,this->sft_);
  SwitchingFunction::setSwitch(this->switcher_,this->rSwitch_,this->rCut_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
               *)(local_98 + 8));
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree((_Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
               *)local_60);
  return;
}

Assistant:

void ForceManager::setupCutoffs() {
    Globals* simParams_ = info_->getSimParams();
    int mdFileVersion;
    rCut_ = 0.0;  // Needs a value for a later max() call;

    if (simParams_->haveMDfileVersion())
      mdFileVersion = simParams_->getMDfileVersion();
    else
      mdFileVersion = 0;

    // We need the list of simulated atom types to figure out cutoffs
    // as well as long range corrections.

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes_;
    atomTypes_ = info_->getSimulatedAtomTypes();

    if (simParams_->haveCutoffRadius()) {
      rCut_ = simParams_->getCutoffRadius();
    } else {
      if (info_->usesElectrostaticAtoms()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use a default value of 12.0 angstroms "
                 "for the cutoffRadius.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        rCut_ = 12.0;
      } else {
        RealType thisCut;
        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
          thisCut = interactionMan_->getSuggestedCutoffRadius((*i));
          rCut_   = max(thisCut, rCut_);
        }
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use %lf angstroms.\n",
                 rCut_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }

    fDecomp_->setCutoffRadius(rCut_);
    interactionMan_->setCutoffRadius(rCut_);
    rCutSq_ = rCut_ * rCut_;

    map<string, CutoffMethod> stringToCutoffMethod;
    stringToCutoffMethod["HARD"]              = HARD;
    stringToCutoffMethod["SWITCHED"]          = SWITCHED;
    stringToCutoffMethod["SHIFTED_POTENTIAL"] = SHIFTED_POTENTIAL;
    stringToCutoffMethod["SHIFTED_FORCE"]     = SHIFTED_FORCE;
    stringToCutoffMethod["TAYLOR_SHIFTED"]    = TAYLOR_SHIFTED;
    stringToCutoffMethod["EWALD_FULL"]        = EWALD_FULL;

    if (simParams_->haveCutoffMethod()) {
      string cutMeth = toUpperCopy(simParams_->getCutoffMethod());
      map<string, CutoffMethod>::iterator i;
      i = stringToCutoffMethod.find(cutMeth);
      if (i == stringToCutoffMethod.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: Could not find chosen "
                 "cutoffMethod %s\n"
                 "\tShould be one of: "
                 "HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n"
                 "\tSHIFTED_FORCE, or EWALD_FULL\n",
                 cutMeth.c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        cutoffMethod_ = i->second;
      }
    } else {
      if (mdFileVersion > 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set "
                 "for the cutoffMethod.\n"
                 "\tOpenMD will use SHIFTED_FORCE.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        cutoffMethod_ = SHIFTED_FORCE;
      } else {
        // handle the case where the old file version was in play
        // (there should be no cutoffMethod, so we have to deduce it
        // from other data).

        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n"
                 "\tOpenMD found a file which does not set a cutoffMethod.\n"
                 "\tOpenMD will attempt to deduce a cutoffMethod using the\n"
                 "\tbehavior of the older (version 1) code.  To remove this\n"
                 "\twarning, add an explicit cutoffMethod and change the top\n"
                 "\tof the file so that it begins with <OpenMD version=2>\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();

        // The old file version tethered the shifting behavior to the
        // electrostaticSummationMethod keyword.

        if (simParams_->haveElectrostaticSummationMethod()) {
          string myMethod = simParams_->getElectrostaticSummationMethod();
          toUpper(myMethod);

          if (myMethod == "SHIFTED_POTENTIAL") {
            cutoffMethod_ = SHIFTED_POTENTIAL;
          } else if (myMethod == "SHIFTED_FORCE") {
            cutoffMethod_ = SHIFTED_FORCE;
          } else if (myMethod == "TAYLOR_SHIFTED") {
            cutoffMethod_ = TAYLOR_SHIFTED;
          } else if (myMethod == "EWALD_FULL") {
            cutoffMethod_   = EWALD_FULL;
            useSurfaceTerm_ = true;
          }

          if (simParams_->haveSwitchingRadius())
            rSwitch_ = simParams_->getSwitchingRadius();

          if (myMethod == "SHIFTED_POTENTIAL" || myMethod == "SHIFTED_FORCE" ||
              myMethod == "TAYLOR_SHIFTED" || myMethod == "EWALD_FULL") {
            if (simParams_->haveSwitchingRadius()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n"
                       "\tA value was set for the switchingRadius\n"
                       "\teven though the electrostaticSummationMethod was\n"
                       "\tset to %s\n",
                       myMethod.c_str());
              painCave.severity = OPENMD_WARNING;
              painCave.isFatal  = 1;
              simError();
            }
          }
          if (abs(rCut_ - rSwitch_) < 0.0001) {
            if (cutoffMethod_ == SHIFTED_FORCE) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted force\n"
                       "\tpotentials instead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            } else {
              cutoffMethod_ = SHIFTED_POTENTIAL;
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted potentials\n"
                       "\tinstead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            }
          }
        }
      }
    }

    // create the switching function object:

    switcher_ = new SwitchingFunction();

    if (cutoffMethod_ == SWITCHED) {
      if (simParams_->haveSwitchingRadius()) {
        rSwitch_ = simParams_->getSwitchingRadius();
        if (rSwitch_ > rCut_) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: switchingRadius (%f) is larger "
                   "than the cutoffRadius(%f)\n",
                   rSwitch_, rCut_);
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      } else {
        rSwitch_ = 0.85 * rCut_;
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "switchingRadius.\n"
                 "\tOpenMD will use a default value of 85 percent of the "
                 "cutoffRadius.\n"
                 "\tswitchingRadius = %f. for this simulation\n",
                 rSwitch_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      }
    } else {
      if (mdFileVersion > 1) {
        // throw an error if we define a switching radius and don't need one.
        // older file versions should not do this.
        if (simParams_->haveSwitchingRadius()) {
          map<string, CutoffMethod>::const_iterator it;
          string theMeth;
          for (it = stringToCutoffMethod.begin();
               it != stringToCutoffMethod.end(); ++it) {
            if (it->second == cutoffMethod_) {
              theMeth = it->first;
              break;
            }
          }
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: the cutoffMethod (%s)\n"
                   "\tis not set to SWITCHED, so switchingRadius value\n"
                   "\twill be ignored for this simulation\n",
                   theMeth.c_str());
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
      rSwitch_ = rCut_;
    }

    // Default to cubic switching function.
    sft_ = cubic;
    if (simParams_->haveSwitchingFunctionType()) {
      string funcType = simParams_->getSwitchingFunctionType();
      toUpper(funcType);
      if (funcType == "CUBIC") {
        sft_ = cubic;
      } else {
        if (funcType == "FIFTH_ORDER_POLYNOMIAL") {
          sft_ = fifth_order_poly;
        } else {
          // throw error
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "ForceManager::setupSwitching : Unknown switchingFunctionType. "
              "(Input "
              "file specified %s .)\n"
              "\tswitchingFunctionType must be one of: "
              "\"cubic\" or \"fifth_order_polynomial\".",
              funcType.c_str());
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      }
    }
    switcher_->setSwitchType(sft_);
    switcher_->setSwitch(rSwitch_, rCut_);
  }